

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test10::test(GPUShaderFP64Test10 *this,functionEnum function,typeDetails *type)

{
  GLuint program_id;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  functionObject *function_object;
  uint vertex;
  GPUShaderFP64Test10 *this_00;
  bool bVar5;
  char cVar6;
  programInfo program;
  programInfo local_58;
  long lVar4;
  
  this_00 = (GPUShaderFP64Test10 *)((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*(this_00->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  cVar6 = isFunctionImplemented::look_up_table[function][type->m_general_type];
  if ((bool)cVar6 == true) {
    if ((function == FUNCTION_INVERSE) || (function == FUNCTION_DETERMINANT)) {
      cVar6 = type->m_n_columns == type->m_n_rows;
    }
    else if (function == FUNCTION_CROSS) {
      cVar6 = type->m_n_rows == 3;
    }
  }
  bVar5 = true;
  if (cVar6 != '\0') {
    local_58.m_context = (this->super_TestCase).m_context;
    local_58.m_compute_shader_id = 0;
    local_58.m_fragment_shader_id = 0;
    local_58.m_geometry_shader_id = 0;
    local_58.m_program_object_id = 0;
    local_58.m_tesselation_control_shader_id = 0;
    local_58.m_tesselation_evaluation_shader_id = 0;
    local_58.m_vertex_shader_id = 0;
    function_object = getFunctionObject(this_00,function,type);
    prepareProgram(this,function_object,&local_58);
    prepareTestData(this,function_object);
    program_id = local_58.m_program_object_id;
    (**(code **)(lVar4 + 0x1680))();
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x3b0d);
    bVar5 = false;
    vertex = 0;
    do {
      testBegin(this,function_object,program_id,vertex);
      (**(code **)(lVar4 + 0x30))(0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"BeginTransformFeedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3b14);
      (**(code **)(lVar4 + 0x538))(0,0,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"DrawArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3b17);
      (**(code **)(lVar4 + 0x638))();
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"EndTransformFeedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3b1a);
      bVar1 = verifyResults(this,function_object,vertex);
      if (!bVar1) break;
      bVar5 = 0x3fe < vertex;
      vertex = vertex + 1;
    } while (vertex != 0x400);
    (*function_object->_vptr_functionObject[1])(function_object);
    Utils::programInfo::~programInfo(&local_58);
  }
  return bVar5;
}

Assistant:

bool GPUShaderFP64Test10::test(functionEnum function, const typeDetails& type)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if function is not implemented for type */
	if (false == isFunctionImplemented(function, type))
	{
		return true;
	}

	Utils::programInfo			  program(m_context);
	std::auto_ptr<functionObject> function_object(getFunctionObject(function, type));

	prepareProgram(*function_object, program);
	prepareTestData(*function_object);

	/* Set up program */
	gl.useProgram(program.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	for (glw::GLuint vertex = 0; vertex < m_n_veritces; ++vertex)
	{
		testBegin(*function_object, program.m_program_object_id, vertex);

		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

		if (false == verifyResults(*function_object, vertex))
		{
			return false;
		}
	}

	return true;
}